

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

FFont * V_GetFont(char *name)

{
  bool bVar1;
  FTextureID local_68 [2];
  FTextureID picnum;
  undefined1 local_58 [8];
  FWadLump lumpy;
  uint32 head;
  int lump;
  FFont *font;
  char *name_local;
  
  _head = (FSingleLumpFont *)FFont::FindFont(name);
  if (_head == (FSingleLumpFont *)0x0) {
    lumpy.Lump._4_4_ = 0xffffffff;
    lumpy.Lump._4_4_ = FWadCollection::CheckNumForFullName(&Wads,name,true,0);
    if (lumpy.Lump._4_4_ != -1) {
      FWadCollection::OpenLumpNum((FWadLump *)local_58,&Wads,lumpy.Lump._4_4_);
      FWadLump::Read((FWadLump *)local_58,&lumpy.Lump,4);
      FWadLump::~FWadLump((FWadLump *)local_58);
      if ((((uint)lumpy.Lump & 0xffffff) == 0x4e4f46) || ((uint)lumpy.Lump == 0x1ad5e6e1)) {
        _head = (FSingleLumpFont *)operator_new(0x368);
        FSingleLumpFont::FSingleLumpFont(_head,name,lumpy.Lump._4_4_);
      }
    }
    if (_head == (FSingleLumpFont *)0x0) {
      local_68[0] = FTextureManager::CheckForTexture(&TexMan,name,0,1);
      bVar1 = FTextureID::isValid(local_68);
      if (bVar1) {
        _head = (FSingleLumpFont *)operator_new(0x68);
        FSinglePicFont::FSinglePicFont((FSinglePicFont *)_head,name);
      }
    }
  }
  return &_head->super_FFont;
}

Assistant:

FFont *V_GetFont(const char *name)
{
	FFont *font = FFont::FindFont (name);
	if (font == NULL)
	{
		int lump = -1;

		lump = Wads.CheckNumForFullName(name, true);
		
		if (lump != -1)
		{
			uint32 head;
			{
				FWadLump lumpy = Wads.OpenLumpNum (lump);
				lumpy.Read (&head, 4);
			}
			if ((head & MAKE_ID(255,255,255,0)) == MAKE_ID('F','O','N',0) ||
				head == MAKE_ID(0xE1,0xE6,0xD5,0x1A))
			{
				font = new FSingleLumpFont (name, lump);
			}
		}
		if (font == NULL)
		{
			FTextureID picnum = TexMan.CheckForTexture (name, FTexture::TEX_Any);
			if (picnum.isValid())
			{
				font = new FSinglePicFont (name);
			}
		}
	}
	return font;
}